

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionLexer.cxx
# Opt level: O0

vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> * __thiscall
cmGeneratorExpressionLexer::Tokenize
          (vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>
           *__return_storage_ptr__,cmGeneratorExpressionLexer *this,string *input)

{
  cmGeneratorExpressionToken local_a8;
  cmGeneratorExpressionToken local_90;
  cmGeneratorExpressionToken local_78;
  cmGeneratorExpressionToken local_60;
  char *local_38;
  char *upto;
  char *c;
  string *local_20;
  string *input_local;
  cmGeneratorExpressionLexer *this_local;
  vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_> *result;
  
  c._7_1_ = 0;
  local_20 = input;
  input_local = (string *)this;
  this_local = (cmGeneratorExpressionLexer *)__return_storage_ptr__;
  std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::vector
            (__return_storage_ptr__);
  local_38 = (char *)std::__cxx11::string::c_str();
  for (upto = local_38; *upto != '\0'; upto = upto + 1) {
    switch(*upto) {
    case '$':
      if (upto[1] == '<') {
        InsertText(local_38,upto,__return_storage_ptr__);
        cmGeneratorExpressionToken::cmGeneratorExpressionToken(&local_60,1,upto,2);
        std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
        push_back(__return_storage_ptr__,&local_60);
        local_38 = upto + 2;
        upto = upto + 1;
        this->SawBeginExpression = true;
      }
      break;
    default:
      break;
    case ',':
      InsertText(local_38,upto,__return_storage_ptr__);
      cmGeneratorExpressionToken::cmGeneratorExpressionToken(&local_a8,4,upto,1);
      std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
      push_back(__return_storage_ptr__,&local_a8);
      local_38 = upto + 1;
      break;
    case ':':
      InsertText(local_38,upto,__return_storage_ptr__);
      cmGeneratorExpressionToken::cmGeneratorExpressionToken(&local_90,3,upto,1);
      std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
      push_back(__return_storage_ptr__,&local_90);
      local_38 = upto + 1;
      break;
    case '>':
      InsertText(local_38,upto,__return_storage_ptr__);
      cmGeneratorExpressionToken::cmGeneratorExpressionToken(&local_78,2,upto,1);
      std::vector<cmGeneratorExpressionToken,_std::allocator<cmGeneratorExpressionToken>_>::
      push_back(__return_storage_ptr__,&local_78);
      local_38 = upto + 1;
      this->SawGeneratorExpression = (bool)(this->SawBeginExpression & 1);
    }
  }
  InsertText(local_38,upto,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cmGeneratorExpressionToken>
cmGeneratorExpressionLexer::Tokenize(const std::string& input)
{
  std::vector<cmGeneratorExpressionToken> result;

  const char *c = input.c_str();
  const char *upto = c;

  for ( ; *c; ++c)
    {
    switch(*c)
      {
      case '$':
        if(c[1] == '<')
          {
          InsertText(upto, c, result);
          result.push_back(cmGeneratorExpressionToken(
                           cmGeneratorExpressionToken::BeginExpression, c, 2));
          upto = c + 2;
          ++c;
          SawBeginExpression = true;
          }
        break;
      case '>':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::EndExpression, c, 1));
        upto = c + 1;
        SawGeneratorExpression = SawBeginExpression;
        break;
      case ':':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::ColonSeparator, c, 1));
        upto = c + 1;
        break;
      case ',':
        InsertText(upto, c, result);
        result.push_back(cmGeneratorExpressionToken(
                            cmGeneratorExpressionToken::CommaSeparator, c, 1));
        upto = c + 1;
        break;
      default:
        break;
      }
  }
  InsertText(upto, c, result);

  return result;
}